

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

btVector3 __thiscall gjkepa2_impl::MinkowskiDiff::Support(MinkowskiDiff *this,btVector3 *d,U index)

{
  int in_EDX;
  MinkowskiDiff *in_RSI;
  btVector3 bVar1;
  uint in_stack_ffffffffffffffd8;
  undefined1 local_10 [16];
  
  if (in_EDX == 0) {
    local_10 = (undefined1  [16])Support0(in_RSI,(btVector3 *)(ulong)in_stack_ffffffffffffffd8);
  }
  else {
    local_10 = (undefined1  [16])Support1(this,d);
  }
  bVar1.m_floats[0] = (btScalar)local_10._0_4_;
  bVar1.m_floats[1] = (btScalar)local_10._4_4_;
  bVar1.m_floats[2] = (btScalar)local_10._8_4_;
  bVar1.m_floats[3] = (btScalar)local_10._12_4_;
  return (btVector3)bVar1.m_floats;
}

Assistant:

btVector3				Support(const btVector3& d,U index) const
		{
			if(index)
				return(Support1(d));
			else
				return(Support0(d));
		}